

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

bool __thiscall libcellml::Annotator::isUnique(Annotator *this,string *id)

{
  AnnotatorImpl *pAVar1;
  size_type sVar2;
  string *id_local;
  Annotator *this_local;
  
  pAVar1 = pFunc(this);
  AnnotatorImpl::update(pAVar1);
  pAVar1 = pFunc(this);
  sVar2 = std::
          multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<libcellml::AnyCellmlElement>_>_>_>
          ::count(&pAVar1->mIdList,id);
  return sVar2 == 1;
}

Assistant:

bool Annotator::isUnique(const std::string &id)
{
    pFunc()->update();
    return pFunc()->mIdList.count(id) == 1;
}